

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BigPropertyIndex __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetPropertyIndex_EnumerateTTD
          (DictionaryTypeHandlerBase<unsigned_short> *this,PropertyRecord *pRecord)

{
  int iVar1;
  PropertyId PVar2;
  PropertyId PVar3;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar4;
  PropertyRecord **ppPVar5;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar6;
  DictionaryPropertyDescriptor<unsigned_short> *idescriptor;
  PropertyId pid;
  BigPropertyIndex index;
  PropertyRecord *pRecord_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  idescriptor._4_4_ = 0;
  while( true ) {
    pBVar4 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    iVar1 = JsUtil::
            BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Count(pBVar4);
    if (iVar1 <= idescriptor._4_4_) {
      TTDAbort_unrecoverable_error("We found this and not accessor but NoBigSlot for index?");
    }
    pBVar4 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    ppPVar5 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetKeyAt(pBVar4,idescriptor._4_4_);
    PVar2 = PropertyRecord::GetPropertyId(*ppPVar5);
    pBVar4 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    pDVar6 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt(pBVar4,idescriptor._4_4_);
    PVar3 = PropertyRecord::GetPropertyId(pRecord);
    if ((PVar2 == PVar3) && ((pDVar6->Attributes & 8) == 0)) break;
    idescriptor._4_4_ = idescriptor._4_4_ + 1;
  }
  return idescriptor._4_4_;
}

Assistant:

Js::BigPropertyIndex DictionaryTypeHandlerBase<T>::GetPropertyIndex_EnumerateTTD(const Js::PropertyRecord* pRecord)
    {
        for (Js::BigPropertyIndex index = 0; index < this->propertyMap->Count(); index++)
        {
            Js::PropertyId pid = this->propertyMap->GetKeyAt(index)->GetPropertyId();
            const DictionaryPropertyDescriptor<T>& idescriptor = propertyMap->GetValueAt(index);

            if (pid == pRecord->GetPropertyId() && !(idescriptor.Attributes & PropertyDeleted))
            {
                return index;
            }
        }

        TTDAssert(false, "We found this and not accessor but NoBigSlot for index?");
        return Js::Constants::NoBigSlot;
    }